

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

bool __thiscall despot::util::tinyxml::TiXmlText::Blank(TiXmlText *this)

{
  byte bVar1;
  Rep *pRVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pRVar2 = (this->super_TiXmlNode).value.rep_;
  uVar3 = pRVar2->size;
  bVar8 = uVar3 == 0;
  if (!bVar8) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      bVar1 = pRVar2->str[uVar6];
      iVar5 = isspace((uint)bVar1);
      if (((iVar5 == 0) && (bVar1 != 0xd)) && (bVar1 != 10)) {
        return bVar8;
      }
      bVar8 = uVar3 <= uVar7;
      bVar4 = uVar7 < uVar3;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  return bVar8;
}

Assistant:

bool TiXmlText::Blank() const {
	for (unsigned i = 0; i < value.length(); i++)
		if (!IsWhiteSpace(value[i]))
			return false;
	return true;
}